

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<double,_2UL>_> *value)

{
  bool bVar1;
  undefined1 local_38 [8];
  double2 v;
  optional<std::array<double,_2UL>_> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<double,_2UL>_>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(double2 *)local_38);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<double,2ul>>::operator=
                ((optional<std::array<double,2ul>> *)value,(array<double,_2UL> *)local_38);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::double2> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::double2 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}